

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void discordpp::from_json(json *j,field<discordpp::MessageReference> *f)

{
  state sVar1;
  undefined8 __p;
  undefined1 local_78 [104];
  
  if (j->m_type == null) {
    std::
    __uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
    ::reset((__uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
             *)f,(pointer)0x0);
    sVar1 = nulled_e;
  }
  else {
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<discordpp::MessageReference,_0>(local_78 + 8,j);
    std::make_unique<discordpp::MessageReference,discordpp::MessageReference>
              ((MessageReference *)local_78);
    __p = local_78._0_8_;
    local_78._0_8_ =
         (__uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
          )0x0;
    std::
    __uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
    ::reset((__uniq_ptr_impl<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
             *)f,(pointer)__p);
    std::unique_ptr<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
    ::~unique_ptr((unique_ptr<discordpp::MessageReference,_std::default_delete<discordpp::MessageReference>_>
                   *)local_78);
    MessageReference::~MessageReference((MessageReference *)(local_78 + 8));
    sVar1 = present_e;
  }
  f->s_ = sVar1;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }